

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_quaternion.cpp
# Opt level: O0

bool __thiscall ON_Quaternion::Unitize(ON_Quaternion *this)

{
  bool bVar1;
  double dVar2;
  undefined1 local_40 [8];
  ON_Quaternion q;
  double x;
  ON_Quaternion *this_local;
  
  q.d = Length(this);
  if (q.d <= 2.2250738585072014e-308) {
    if (q.d <= 0.0) {
      return false;
    }
    ON_Quaternion((ON_Quaternion *)local_40,this->a * 1e+300,this->b * 1e+300,this->c * 1e+300,
                  this->c * 1e+300);
    bVar1 = Unitize((ON_Quaternion *)local_40);
    if (!bVar1) {
      return false;
    }
    this->a = (double)local_40;
    this->b = q.a;
    this->c = q.b;
    this->d = q.c;
  }
  else {
    dVar2 = 1.0 / q.d;
    this->a = dVar2 * this->a;
    this->b = dVar2 * this->b;
    this->c = dVar2 * this->c;
    this->d = dVar2 * this->d;
  }
  return true;
}

Assistant:

bool ON_Quaternion::Unitize()
{
  double x = Length();

  if (x > ON_DBL_MIN)
  {
    x = 1.0/x;
    a *= x; b *= x; c *= x; d *= x;
  }
  else if ( x > 0.0 )
  {
    ON_Quaternion q(a*1.0e300,b*1.0e300,c*1.0e300,c*1.0e300);
    if ( !q.Unitize() )
      return false;
    a = q.a; 
    b = q.b;
    c = q.c;
    d = q.d;
  }
  else
  {
    return false;
  }

  return true;
}